

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O0

Vec_Str_t * Abc_NtkRRSimulate(Abc_Ntk_t *pNtk)

{
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Str_t *p;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *vNodes_00;
  Vec_Ptr_t *vField_00;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar7;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar8;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar9;
  uint local_74;
  uint local_70;
  int local_4c;
  int local_48;
  int k;
  int i;
  int Phase;
  int PrevCi;
  uint uData1;
  uint uData0;
  uint uData;
  Abc_Obj_t *pObj;
  Vec_Str_t *vTargets;
  Vec_Ptr_t *vField;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkObjNumMax(pNtk);
  p = Vec_StrStart(iVar2 + 1);
  for (local_48 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_48 < iVar2; local_48 = local_48 + 1) {
    pAVar5 = Abc_NtkObj(pNtk,local_48);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar5), iVar2 != 0)) {
      pAVar6 = Abc_ObjFanin1(pAVar5);
      iVar2 = Abc_ObjFanoutNum(pAVar6);
      pAVar6 = Abc_ObjFanin0(pAVar5);
      iVar3 = Abc_ObjFanoutNum(pAVar6);
      Vec_StrWriteEntry(p,pAVar5->Id,1 < iVar3 | (1 < iVar2) << 1);
    }
  }
  pAVar5 = Abc_AigConst1(pNtk);
  pAVar5->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0xffffffff;
  for (local_48 = 0; iVar2 = Abc_NtkCiNum(pNtk), local_48 < iVar2; local_48 = local_48 + 1) {
    pAVar5 = Abc_NtkCi(pNtk,local_48);
    iVar2 = rand();
    iVar3 = rand();
    uVar4 = rand();
    aVar7._4_4_ = 0;
    aVar7.iTemp = iVar2 << 0x18 ^ iVar3 << 0xc ^ uVar4;
    pAVar5->field_6 = aVar7;
  }
  for (local_48 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_48 < iVar2; local_48 = local_48 + 1) {
    pAVar5 = Abc_NtkObj(pNtk,local_48);
    if (((pAVar5 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar5), iVar2 != 0)) &&
       (local_48 != 0)) {
      pAVar6 = Abc_ObjFanin0(pAVar5);
      local_70 = (pAVar6->field_5).iData;
      pAVar6 = Abc_ObjFanin1(pAVar5);
      local_74 = (pAVar6->field_5).iData;
      iVar2 = Abc_ObjFaninC0(pAVar5);
      if (iVar2 != 0) {
        local_70 = local_70 ^ 0xffffffff;
      }
      iVar2 = Abc_ObjFaninC1(pAVar5);
      if (iVar2 != 0) {
        local_74 = local_74 ^ 0xffffffff;
      }
      aVar8._4_4_ = 0;
      aVar8.iTemp = local_74 & local_70;
      pAVar5->field_6 = aVar8;
    }
  }
  for (local_48 = 0; iVar2 = Abc_NtkCoNum(pNtk), local_48 < iVar2; local_48 = local_48 + 1) {
    pAVar5 = Abc_NtkCo(pNtk,local_48);
    pAVar6 = Abc_ObjFanin0(pAVar5);
    aVar1 = pAVar6->field_5;
    iVar2 = Abc_ObjFaninC0(pAVar5);
    if (iVar2 == 0) {
      (pAVar5->field_5).pData = aVar1.pData & 0xffffffff;
    }
    else {
      aVar9._4_4_ = 0;
      aVar9.iData = aVar1.iData ^ 0xffffffff;
      pAVar5->field_5 = aVar9;
    }
  }
  i = 0;
  do {
    iVar2 = Abc_NtkCiNum(pNtk);
    if (iVar2 <= i) {
      for (local_48 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_48 < iVar2; local_48 = local_48 + 1
          ) {
        pAVar5 = Abc_NtkObj(pNtk,local_48);
        if (pAVar5 != (Abc_Obj_t *)0x0) {
          (pAVar5->field_5).pData = (void *)0x0;
        }
      }
      return p;
    }
    vNodes_00 = Vec_PtrAlloc(10);
    Abc_NtkIncrementTravId(pNtk);
    for (local_48 = i; iVar2 = Abc_NtkCiNum(pNtk), local_48 < iVar2; local_48 = local_48 + 1) {
      pAVar5 = Abc_NtkCi(pNtk,local_48);
      Sim_TraverseNodes_rec(pAVar5,p,vNodes_00);
      iVar2 = Vec_PtrSize(vNodes_00);
      if (0x80 < iVar2) break;
    }
    vField_00 = Vec_PtrAlloc(10);
    Abc_NtkIncrementTravId(pNtk);
    for (local_4c = 0; iVar2 = Abc_NtkCoNum(pNtk), local_4c < iVar2; local_4c = local_4c + 1) {
      pAVar5 = Abc_NtkCo(pNtk,local_4c);
      Sim_CollectNodes_rec(pAVar5,vField_00);
    }
    Sim_SimulateCollected(p,vNodes_00,vField_00);
    Vec_PtrFree(vNodes_00);
    i = local_48;
  } while( true );
}

Assistant:

Vec_Str_t * Abc_NtkRRSimulate( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes, * vField;
    Vec_Str_t * vTargets;
    Abc_Obj_t * pObj;
    unsigned uData, uData0, uData1;
    int PrevCi, Phase, i, k;

    // start the candidates
    vTargets = Vec_StrStart( Abc_NtkObjNumMax(pNtk) + 1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Phase = ((Abc_ObjFanoutNum(Abc_ObjFanin1(pObj)) > 1) << 1);
        Phase |= (Abc_ObjFanoutNum(Abc_ObjFanin0(pObj)) > 1);
        Vec_StrWriteEntry( vTargets, pObj->Id, (char)Phase );
    }

    // simulate patters and store them in copy
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)~((unsigned)0);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)SIM_RANDOM_UNSIGNED;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( i == 0 ) continue;
        uData0 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pData;
        uData1 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin1(pObj)->pData;
        uData  = Abc_ObjFaninC0(pObj)? ~uData0 : uData0;
        uData &= Abc_ObjFaninC1(pObj)? ~uData1 : uData1;
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)uData;
    }
    // store the result in data
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        uData0 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pData;
        if ( Abc_ObjFaninC0(pObj) )
            pObj->pData = (void *)(ABC_PTRUINT_T)~uData0;
        else
            pObj->pData = (void *)(ABC_PTRUINT_T)uData0;
    }

    // refine the candidates
    for ( PrevCi = 0; PrevCi < Abc_NtkCiNum(pNtk); PrevCi = i )
    {
        vNodes = Vec_PtrAlloc( 10 );
        Abc_NtkIncrementTravId( pNtk );
        for ( i = PrevCi; i < Abc_NtkCiNum(pNtk); i++ )
        {
            Sim_TraverseNodes_rec( Abc_NtkCi(pNtk, i), vTargets, vNodes );
            if ( Vec_PtrSize(vNodes) > 128 )
                break;
        }
        // collect the marked nodes in the topological order
        vField = Vec_PtrAlloc( 10 );
        Abc_NtkIncrementTravId( pNtk );
        Abc_NtkForEachCo( pNtk, pObj, k )
            Sim_CollectNodes_rec( pObj, vField );

        // simulate these nodes
        Sim_SimulateCollected( vTargets, vNodes, vField );
        // prepare for the next loop
        Vec_PtrFree( vNodes );
    }

    // clean
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->pData = NULL;
    return vTargets;
}